

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamANCF_3243::SetDimensions
          (ChElementBeamANCF_3243 *this,double lenX,double thicknessY,double thicknessZ)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  this->m_lenX = lenX;
  this->m_thicknessY = thicknessY;
  this->m_thicknessZ = thicknessZ;
  lVar1 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_cols * (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_rows;
  lVar2 = (this->m_O1).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols * (this->m_O1).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
  lVar3 = lVar2 + lVar1;
  if (lVar3 == 0 || SCARRY8(lVar2,lVar1) != lVar3 < 0) {
    return;
  }
  PrecomputeInternalForceMatricesWeights(this);
  return;
}

Assistant:

void ChElementBeamANCF_3243::SetDimensions(double lenX, double thicknessY, double thicknessZ) {
    m_lenX = lenX;
    m_thicknessY = thicknessY;
    m_thicknessZ = thicknessZ;

    // Check to see if SetupInitial has already been called (i.e. at least one set of precomputed matrices has been
    // populated).  If so, the precomputed matrices will need to be re-generated.  If not, this will be handled once
    // SetupInitial is called.
    if (m_SD.size() + m_O1.size() > 0) {
        PrecomputeInternalForceMatricesWeights();
    }
}